

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# callback.h
# Opt level: O2

void __thiscall
booster::callback<void(std::error_code_const&,unsigned_long)>::
callback<void(*)(std::error_code_const&,unsigned_long)>
          (callback<void(std::error_code_const&,unsigned_long)> *this,
          _func_void_error_code_ptr_unsigned_long *func)

{
  callable_impl<void,_void_(*)(const_std::error_code_&,_unsigned_long)> *this_00;
  
  this_00 = (callable_impl<void,_void_(*)(const_std::error_code_&,_unsigned_long)> *)
            operator_new(0x18);
  callback<void_(const_std::error_code_&,_unsigned_long)>::
  callable_impl<void,_void_(*)(const_std::error_code_&,_unsigned_long)>::callable_impl(this_00,func)
  ;
  *(callable_impl<void,_void_(*)(const_std::error_code_&,_unsigned_long)> **)this = this_00;
  booster::atomic_counter::inc();
  return;
}

Assistant:

callback(F func) : call_ptr(new callable_impl<Result,F>(func)) 	
		{}